

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall HighsSparseMatrix::scaleCol(HighsSparseMatrix *this,HighsInt col,double colScale)

{
  bool bVar1;
  reference pvVar2;
  reference pvVar3;
  int in_ESI;
  HighsSparseMatrix *in_RDI;
  double in_XMM0_Qa;
  HighsInt iEl_1;
  HighsInt iRow;
  HighsInt iEl;
  int local_24;
  int local_20;
  int local_1c;
  
  bVar1 = isColwise(in_RDI);
  if (bVar1) {
    pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)in_ESI);
    for (local_1c = *pvVar2;
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                           (&in_RDI->start_,(long)(in_ESI + 1)), local_1c < *pvVar2;
        local_1c = local_1c + 1) {
      pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                         (&in_RDI->value_,(long)local_1c);
      *pvVar3 = in_XMM0_Qa * *pvVar3;
    }
  }
  else {
    for (local_20 = 0; local_20 < in_RDI->num_row_; local_20 = local_20 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_20);
      for (local_24 = *pvVar2;
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_20 + 1)), local_24 < *pvVar2;
          local_24 = local_24 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_24);
        if (*pvVar2 == in_ESI) {
          pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                             (&in_RDI->value_,(long)local_24);
          *pvVar3 = in_XMM0_Qa * *pvVar3;
        }
      }
    }
  }
  return;
}

Assistant:

void HighsSparseMatrix::scaleCol(const HighsInt col, const double colScale) {
  assert(this->formatOk());
  assert(col >= 0);
  assert(col < this->num_col_);
  assert(colScale);

  if (this->isColwise()) {
    for (HighsInt iEl = this->start_[col]; iEl < this->start_[col + 1]; iEl++)
      this->value_[iEl] *= colScale;
  } else {
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++) {
        if (this->index_[iEl] == col) this->value_[iEl] *= colScale;
      }
    }
  }
}